

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactiveDevice.cpp
# Opt level: O0

void __thiscall
Apple::ADB::ReactiveDevice::adb_bus_did_observe_event
          (ReactiveDevice *this,Event event,uint8_t value)

{
  value_type vVar1;
  Type TVar2;
  initializer_list<unsigned_char> __l;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  Command CVar6;
  allocator<unsigned_char> local_4b;
  uchar local_4a;
  undefined1 local_49;
  iterator local_48;
  size_type local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  Type local_20;
  undefined2 local_1c;
  uint8_t local_15;
  Event local_14;
  uint8_t value_local;
  ReactiveDevice *pRStack_10;
  Event event_local;
  ReactiveDevice *this_local;
  
  if (this->phase_ == AwaitingAttention) {
    if (event == Attention) {
      this->phase_ = AwaitingCommand;
    }
  }
  else if (event == Byte) {
    local_15 = value;
    local_14 = event;
    pRStack_10 = this;
    if (this->phase_ == AwaitingContent) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->content_,&local_15);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->content_);
      if (sVar4 == this->expected_content_size_) {
        this->phase_ = AwaitingAttention;
        if ((this->command_).reg == '\x03') {
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->content_,0);
          vVar1 = *pvVar5;
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->content_,1);
          this->register3_ = CONCAT11(vVar1,*pvVar5);
        }
        else {
          (*(this->super_Device)._vptr_Device[3])(this,&this->command_,&this->content_);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->content_);
      }
    }
    if (this->phase_ == AwaitingCommand) {
      this->phase_ = AwaitingAttention;
      CVar6 = decode_command(local_15);
      local_20 = CVar6.type;
      local_1c = CVar6._4_2_;
      (this->command_).type = local_20;
      (this->command_).device = (char)local_1c;
      (this->command_).reg = (char)((ushort)local_1c >> 8);
      if (((this->command_).device == 0xff) ||
         ((uint)(this->command_).device == ((int)(uint)this->register3_ >> 8 & 0xfU))) {
        TVar2 = (this->command_).type;
        if (TVar2 == Reset) {
          reset(this);
        }
        else if (TVar2 - Listen < 2) {
          if ((this->command_).reg != '\x03') {
            std::atomic<bool>::operator=(&this->service_desired_,false);
            (*(this->super_Device)._vptr_Device[2])(this,&this->command_);
            return;
          }
          if ((this->command_).type == Talk) {
            local_4a = *(uchar *)((long)&this->register3_ + 1);
            local_49 = (undefined1)this->register3_;
            local_48 = &local_4a;
            local_40 = 2;
            std::allocator<unsigned_char>::allocator(&local_4b);
            __l._M_len = local_40;
            __l._M_array = local_48;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&local_38,__l,&local_4b);
            post_response(this,&local_38);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
            std::allocator<unsigned_char>::~allocator(&local_4b);
            return;
          }
          receive_bytes(this,2);
          return;
        }
        (*(this->super_Device)._vptr_Device[2])(this,&this->command_);
      }
      else {
        bVar3 = std::atomic::operator_cast_to_bool((atomic *)&this->service_desired_);
        if (bVar3) {
          std::atomic<bool>::operator=(&this->service_desired_,false);
          this->stop_has_begin_ = false;
          this->phase_ = ServiceRequestPending;
          this->microseconds_at_bit_ = 0.0;
        }
      }
    }
  }
  return;
}

Assistant:

void ReactiveDevice::adb_bus_did_observe_event(Bus::Event event, uint8_t value) {
	if(phase_ == Phase::AwaitingAttention) {
		if(event != Bus::Event::Attention) return;
		phase_ = Phase::AwaitingCommand;
		return;
	}

	if(event != Bus::Event::Byte) return;

	if(phase_ == Phase::AwaitingContent) {
		content_.push_back(value);
		if(content_.size() == expected_content_size_) {
			phase_ = Phase::AwaitingAttention;

			if(command_.reg == 3) {
				register3_ = uint16_t((content_[0] << 8) | content_[1]);
			} else {
				did_receive_data(command_, content_);
			}
			content_.clear();
		}
	}

	if(phase_ == Phase::AwaitingCommand) {
		phase_ = Phase::AwaitingAttention;

		command_ = decode_command(value);
//		logger.info().append("%d", command_);

		// If this command doesn't apply here, but a service request is requested,
		// post a service request.
		if(command_.device != Command::AllDevices && command_.device != ((register3_ >> 8) & 0xf)) {
			if(service_desired_) {
				service_desired_ = false;
				stop_has_begin_ = false;
				phase_ = Phase::ServiceRequestPending;
				microseconds_at_bit_ = 0.0;
			}
			return;
		}

		// Handle reset and register 3 here automatically; pass everything else along.
		switch(command_.type) {
			case Command::Type::Reset:
				reset();
			[[fallthrough]];
			default:
				perform_command(command_);
			break;

			case Command::Type::Listen:
			case Command::Type::Talk:
				if(command_.reg == 3) {
					if(command_.type == Command::Type::Talk) {
						post_response({uint8_t(register3_ >> 8), uint8_t(register3_ & 0xff)});
					} else {
						receive_bytes(2);
					}
				} else {
					service_desired_ = false;
					perform_command(command_);
				}
			break;
		}
	}
}